

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ClassConfidenceThresholding::ByteSizeLong(ClassConfidenceThresholding *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  size_t sVar3;
  long lVar4;
  int cached_size;
  PrecisionRecallCurve *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  ClassConfidenceThresholding *this_local;
  
  iVar2 = _internal_precisionrecallcurves_size(this);
  sStack_18 = (long)iVar2 * 2;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::begin
                     (&this->precisionrecallcurves_);
  msg = (PrecisionRecallCurve *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::end
                  (&this->precisionrecallcurves_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::PrecisionRecallCurve>::operator!=
                           (&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::PrecisionRecallCurve>::operator*
                      (&__end2);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::PrecisionRecallCurve>(value);
    sStack_18 = sVar3 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::PrecisionRecallCurve>::operator++(&__end2);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    sStack_18 = lVar4 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t ClassConfidenceThresholding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ClassConfidenceThresholding)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.PrecisionRecallCurve precisionRecallCurves = 100;
  total_size += 2UL * this->_internal_precisionrecallcurves_size();
  for (const auto& msg : this->precisionrecallcurves_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}